

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O1

ssize_t __thiscall
cm::uv_async_ptr::send(uv_async_ptr *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pthread_mutex_t *__mutex;
  uv_async_t *handle;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar3;
  
  p_Var1 = (this->super_uv_handle_ptr_<uv_async_s>).super_uv_handle_ptr_base_<uv_async_s>.handle.
           super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    iVar2 = (*p_Var1->_vptr__Sp_counted_base[4])(p_Var1,&uv_handle_deleter<uv_async_s>::typeinfo);
    puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
  }
  if (puVar3 != (undefined8 *)0x0) {
    __mutex = (pthread_mutex_t *)*puVar3;
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 == 0) {
      handle = (this->super_uv_handle_ptr_<uv_async_s>).super_uv_handle_ptr_base_<uv_async_s>.handle
               .super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (handle != (uv_async_t *)0x0) {
        uv_async_send(handle);
      }
      iVar2 = pthread_mutex_unlock(__mutex);
      return CONCAT44(extraout_var_00,iVar2);
    }
    std::__throw_system_error(iVar2);
  }
  __assert_fail("deleter",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmUVHandlePtr.cxx"
                ,0x9f,"void cm::uv_async_ptr::send()");
}

Assistant:

void uv_async_ptr::send()
{
  auto* deleter =
    std::get_deleter<uv_handle_deleter<uv_async_t>>(this->handle);
  assert(deleter);

  std::lock_guard<std::mutex> lock(*deleter->handleMutex);
  if (this->handle) {
    uv_async_send(*this);
  }
}